

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O1

void foreach_bit(bit_vec v,bv_func func,void *p1,void *p2)

{
  int iVar1;
  int j;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  if (0 < v->len) {
    iVar8 = 0;
    lVar5 = 0;
    do {
      iVar1 = (int)lVar5 * 8;
      iVar6 = 3;
      iVar2 = 0;
      iVar7 = iVar8;
      do {
        iVar3 = iVar2 * 4;
        switch((int)v->vec[lVar5] >> ((char)iVar6 - 3U & 0x1f) & 0xf) {
        case 0:
          goto switchD_0010cf0a_caseD_0;
        case 1:
          iVar3 = iVar3 + iVar1;
          break;
        case 2:
          goto switchD_0010cf0a_caseD_2;
        case 3:
          iVar4 = iVar7 + 1;
          goto LAB_0010cfeb;
        case 5:
          iVar4 = iVar7 + 2;
          goto LAB_0010cfeb;
        case 6:
          iVar4 = iVar7 + 2;
          goto LAB_0010d007;
        case 7:
          iVar4 = iVar7 + 2;
          goto LAB_0010cfb0;
        case 8:
          iVar3 = iVar3 + iVar1 + 3;
          break;
        case 9:
          iVar4 = iVar7 + 3;
          goto LAB_0010cfeb;
        case 10:
          iVar4 = iVar7 + 3;
          goto LAB_0010d007;
        case 0xb:
          iVar4 = iVar7 + 3;
LAB_0010cfb0:
          (*func)(iVar4,p1,p2);
          iVar4 = iVar7 + 1;
          goto LAB_0010cfeb;
        case 0xc:
          (*func)(iVar7 + 3,p1,p2);
        case 4:
          iVar3 = iVar3 + iVar1 + 2;
          break;
        case 0xd:
          (*func)(iVar7 + 3,p1,p2);
          iVar4 = iVar7 + 2;
LAB_0010cfeb:
          iVar3 = iVar3 + iVar1;
          (*func)(iVar4,p1,p2);
          break;
        case 0xe:
          (*func)(iVar7 + 3,p1,p2);
          iVar4 = iVar7 + 2;
LAB_0010d007:
          (*func)(iVar4,p1,p2);
switchD_0010cf0a_caseD_2:
          iVar3 = iVar3 + iVar1 + 1;
          break;
        case 0xf:
          (*func)(iVar7 + 3,p1,p2);
          (*func)(iVar7 + 2,p1,p2);
          (*func)(iVar7 + 1,p1,p2);
          iVar3 = iVar7;
        }
        (*func)(iVar3,p1,p2);
switchD_0010cf0a_caseD_0:
        iVar2 = iVar2 + 1;
        iVar6 = iVar6 + 4;
        iVar7 = iVar7 + 4;
      } while (iVar6 == 7);
      lVar5 = lVar5 + 1;
      iVar8 = iVar8 + 8;
    } while (lVar5 < v->len);
  }
  return;
}

Assistant:

void
foreach_bit(bit_vec v, bv_func func, void* p1, void* p2)
{
    int i;
    for (i = 0; i < v->len; i++) {
        int j;
        for (j = 0; j < 2; j++) {
            unsigned char nibble = (v->vec[i] >> (j * 4)) & 0xf;
            switch (nibble) {
            case 0xf:
                func(i * 8 + j * 4 + 3, p1, p2);
                func(i * 8 + j * 4 + 2, p1, p2);
                func(i * 8 + j * 4 + 1, p1, p2);
                func(i * 8 + j * 4 + 0, p1, p2);
                break;
            case 0xe:
                func(i * 8 + j * 4 + 3, p1, p2);
                func(i * 8 + j * 4 + 2, p1, p2);
                func(i * 8 + j * 4 + 1, p1, p2);
                break;
            case 0xd:
                func(i * 8 + j * 4 + 3, p1, p2);
                func(i * 8 + j * 4 + 2, p1, p2);
                func(i * 8 + j * 4 + 0, p1, p2);
                break;
            case 0xc:
                func(i * 8 + j * 4 + 3, p1, p2);
                func(i * 8 + j * 4 + 2, p1, p2);
                break;
            case 0xb:
                func(i * 8 + j * 4 + 3, p1, p2);
                func(i * 8 + j * 4 + 1, p1, p2);
                func(i * 8 + j * 4 + 0, p1, p2);
                break;
            case 0xa:
                func(i * 8 + j * 4 + 3, p1, p2);
                func(i * 8 + j * 4 + 1, p1, p2);
                break;
            case 0x9:
                func(i * 8 + j * 4 + 3, p1, p2);
                func(i * 8 + j * 4 + 0, p1, p2);
                break;
            case 0x8:
                func(i * 8 + j * 4 + 3, p1, p2);
                break;
            case 0x7:
                func(i * 8 + j * 4 + 2, p1, p2);
                func(i * 8 + j * 4 + 1, p1, p2);
                func(i * 8 + j * 4 + 0, p1, p2);
                break;
            case 0x6:
                func(i * 8 + j * 4 + 2, p1, p2);
                func(i * 8 + j * 4 + 1, p1, p2);
                break;
            case 0x5:
                func(i * 8 + j * 4 + 2, p1, p2);
                func(i * 8 + j * 4 + 0, p1, p2);
                break;
            case 0x4:
                func(i * 8 + j * 4 + 2, p1, p2);
                break;
            case 0x3:
                func(i * 8 + j * 4 + 1, p1, p2);
                func(i * 8 + j * 4 + 0, p1, p2);
                break;
            case 0x2:
                func(i * 8 + j * 4 + 1, p1, p2);
                break;
            case 0x1:
                func(i * 8 + j * 4 + 0, p1, p2);
                break;
            case 0x0:
                break;
            }
        }
    }
}